

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O0

int getmbi(_func_int_void_ptr *getin,void *in)

{
  uint uVar1;
  uint local_28;
  int mbi;
  int i;
  void *in_local;
  _func_int_void_ptr *getin_local;
  
  local_28 = 0;
  do {
    uVar1 = (*getin)(in);
    if ((int)uVar1 < 0) {
      return -1;
    }
    local_28 = local_28 << 7 | uVar1 & 0x7f;
  } while ((uVar1 & 0x80) != 0);
  return local_28;
}

Assistant:

int getmbi(int (*getin) (void *in), void *in)
{
	int i, mbi = 0;

	do {
		i = getin(in);
		if(i < 0) {
			return (-1);
		}
		mbi = (mbi << 7) | (i & 0x7f);
	} while(i & 0x80);

	return mbi;
}